

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.h
# Opt level: O0

cmplx klogic::transform::discrete<3>(int n)

{
  cmplx cVar1;
  bool local_1d;
  int n_local;
  
  local_1d = 2 < (uint)n;
  if (local_1d) {
    __assert_fail("n >= 0 && n < K",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/test/../lib/transforms.h"
                  ,0x11,"cmplx klogic::transform::discrete(int) [K = 3]");
  }
  cVar1 = epsilon(n,3);
  return (cmplx)cVar1._M_value;
}

Assistant:

cmplx discrete(int n) {
            assert(n >= 0 && n < K);

            return epsilon(n, K);
        }